

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void dfst(int n,double *a,double *t,int *ip,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  double yi;
  double yr;
  double xi;
  double xr;
  int local_48;
  int nc;
  int nw;
  int mh;
  int m;
  int l;
  int k;
  int j;
  double *w_local;
  int *ip_local;
  double *t_local;
  double *a_local;
  int n_local;
  
  local_48 = *ip;
  if (local_48 * 8 < n) {
    local_48 = n >> 3;
    makewt(local_48,ip,w);
  }
  xr._4_4_ = ip[1];
  iVar8 = n >> 1;
  if (n != xr._4_4_ * 2 && SBORROW4(n,xr._4_4_ * 2) == n + xr._4_4_ * -2 < 0) {
    makect(iVar8,ip,w + local_48);
    xr._4_4_ = iVar8;
  }
  if (2 < n) {
    nw = n >> 2;
    for (l = 1; l < nw; l = l + 1) {
      iVar7 = iVar8 - l;
      dVar1 = a[l];
      dVar2 = a[n - l];
      dVar3 = a[iVar7];
      dVar4 = a[n - iVar7];
      dVar5 = a[iVar7];
      dVar6 = a[n - iVar7];
      a[l] = a[l] + a[n - l];
      a[iVar7] = dVar3 + dVar4;
      t[l] = (dVar1 - dVar2) + (dVar5 - dVar6);
      t[iVar7] = (dVar1 - dVar2) - (dVar5 - dVar6);
    }
    *t = a[nw] - a[n - nw];
    a[nw] = a[n - nw] + a[nw];
    *a = a[iVar8];
    dstsub(iVar8,a,xr._4_4_,w + local_48);
    if (iVar8 < 5) {
      if (iVar8 == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(iVar8,ip + 2,a);
      cftfsub(iVar8,a,w);
      rftfsub(iVar8,a,xr._4_4_,w + local_48);
    }
    a[n + -1] = a[1] - *a;
    a[1] = *a + a[1];
    while (l = iVar8 + -2, 1 < l) {
      a[l * 2 + 1] = a[l] - a[iVar8 + -1];
      a[l * 2 + -1] = -a[l] - a[iVar8 + -1];
      iVar8 = l;
    }
    mh = 2;
    while (1 < nw) {
      dstsub(nw,t,xr._4_4_,w + local_48);
      if (nw < 5) {
        if (nw == 4) {
          cftfsub(4,t,w);
        }
      }
      else {
        bitrv2(nw,ip + 2,t);
        cftfsub(nw,t,w);
        rftfsub(nw,t,xr._4_4_,w + local_48);
      }
      a[n - mh] = t[1] - *t;
      a[mh] = *t + t[1];
      m = 0;
      for (l = 2; l < nw; l = l + 2) {
        m = mh * 4 + m;
        a[m - mh] = -t[l] - t[l + 1];
        a[m + mh] = t[l] - t[l + 1];
      }
      mh = mh << 1;
      iVar8 = nw >> 1;
      for (l = 1; l < iVar8; l = l + 1) {
        iVar7 = nw - l;
        t[l] = t[nw + iVar7] + t[nw + l];
        t[iVar7] = t[nw + iVar7] - t[nw + l];
      }
      *t = t[nw + iVar8];
      nw = iVar8;
    }
    a[mh] = *t;
  }
  *a = 0.0;
  return;
}

Assistant:

void dfst(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    if (n > 2) {
        m = n >> 1;
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] + a[n - j];
            xi = a[j] - a[n - j];
            yr = a[k] + a[n - k];
            yi = a[k] - a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi + yi;
            t[k] = xi - yi;
        }
        t[0] = a[mh] - a[n - mh];
        a[mh] += a[n - mh];
        a[0] = a[m];
        dstsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[1] - a[0];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] - a[j + 1];
            a[2 * j - 1] = -a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dstsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[1] - t[0];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = -t[j] - t[j + 1];
                a[k + l] = t[j] - t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 1; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] + t[m + j];
                t[k] = t[m + k] - t[m + j];
            }
            t[0] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
    }
    a[0] = 0;
}